

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_20<ncnn::BinaryOp_x86_functor::binary_op_rdiv>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128 afVar3;
  __m128 _outp;
  __m128 _p1;
  __m128 _p;
  int i;
  int size;
  float *ptr1;
  int y;
  float *outptr;
  float *ptr;
  int q;
  int elempack;
  int channels;
  int h;
  int w;
  binary_op_rdiv op;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  undefined8 uStack_380;
  float local_378 [2];
  float afStack_370 [2];
  float local_368 [2];
  float afStack_360 [2];
  int local_358;
  int local_354;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined4 local_338;
  long local_330;
  undefined4 local_328;
  undefined4 local_324;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined8 local_310;
  float *local_308;
  int local_2fc;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined4 local_2e0;
  long local_2d8;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined8 local_2b8;
  float *local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  long local_288;
  undefined4 local_280;
  undefined4 local_27c;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined8 local_268;
  float *local_260;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  binary_op_rdiv local_241 [9];
  long *local_238;
  long *local_230;
  long *local_228;
  undefined1 local_21d;
  int local_21c;
  undefined8 *local_210;
  undefined1 local_205;
  int local_204;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined1 local_1b5;
  int local_1b4;
  undefined8 *local_1a8;
  undefined8 *local_198;
  long local_190;
  undefined4 local_184;
  long local_180;
  float *local_178;
  undefined4 local_16c;
  int local_168;
  int local_164;
  undefined8 *local_160;
  long local_158;
  undefined4 local_14c;
  long local_148;
  float *local_140;
  undefined4 local_134;
  int local_130;
  int local_12c;
  undefined8 *local_128;
  long local_120;
  undefined4 local_114;
  long local_110;
  float *local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  undefined4 local_e4;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  undefined4 local_c4;
  long local_c0;
  undefined8 *local_a0;
  undefined8 *local_90;
  undefined8 *local_80;
  float *local_28;
  float *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  float *local_8;
  
  local_248 = *(int *)((long)in_RDI + 0x2c);
  local_24c = (int)in_RDI[6];
  local_250 = (int)in_RDI[7];
  local_254 = (int)in_RDI[3];
  local_238 = in_RDX;
  local_230 = in_RSI;
  local_228 = in_RDI;
  for (local_258 = 0; local_258 < local_250; local_258 = local_258 + 1) {
    local_1f8 = &local_2a8;
    local_12c = *(int *)((long)local_228 + 0x2c);
    local_130 = (int)local_228[6];
    local_134 = *(undefined4 *)((long)local_228 + 0x34);
    local_260 = (float *)(*local_228 + local_228[8] * (long)local_258 * local_228[2]);
    local_148 = local_228[2];
    local_14c = (undefined4)local_228[3];
    local_158 = local_228[4];
    local_128 = &local_2a8;
    local_d0 = (long)local_12c * (long)local_130 * local_148;
    local_1e8 = &local_2a8;
    local_1d0 = &local_2a8;
    local_1a8 = &local_2f8;
    local_164 = *(int *)((long)local_238 + 0x2c);
    local_168 = (int)local_238[6];
    local_16c = *(undefined4 *)((long)local_238 + 0x34);
    local_2b0 = (float *)(*local_238 + local_238[8] * (long)local_258 * local_238[2]);
    local_180 = local_238[2];
    local_184 = (undefined4)local_238[3];
    local_190 = local_238[4];
    local_160 = &local_2f8;
    local_c0 = (long)local_164 * (long)local_168 * local_180;
    local_198 = &local_2f8;
    local_1c8 = &local_2f8;
    local_270 = 0;
    local_274 = 0;
    local_278 = 0;
    local_27c = 0;
    local_290 = 0;
    local_298 = 0;
    local_2a0 = 0;
    local_2a8 = 0;
    local_c4 = 0x10;
    local_d4 = 0x10;
    local_1b4 = local_258;
    local_1b5 = 1;
    local_204 = local_258;
    local_205 = 1;
    local_268 = 0;
    local_280 = 0;
    local_2f8 = 0;
    local_2e8 = 0;
    local_2e0 = 0;
    local_2d0 = 0;
    local_2cc = 0;
    local_2c8 = 0;
    local_2c4 = 0;
    local_2c0 = 0;
    local_2b8 = 0;
    local_2f0 = 0;
    local_178 = local_2b0;
    local_140 = local_260;
    local_90 = local_1c8;
    local_80 = local_1d0;
    local_2d8 = local_190;
    local_288 = local_158;
    for (local_2fc = 0; local_2fc < local_24c; local_2fc = local_2fc + 1) {
      local_210 = &local_350;
      local_f4 = *(int *)((long)local_230 + 0x2c);
      local_f8 = (int)local_230[6];
      local_fc = *(undefined4 *)((long)local_230 + 0x34);
      local_308 = (float *)(*local_230 + local_230[8] * (long)local_258 * local_230[2]);
      local_110 = local_230[2];
      local_114 = (undefined4)local_230[3];
      local_120 = local_230[4];
      local_f0 = &local_350;
      local_e0 = (long)local_f4 * (long)local_f8 * local_110;
      local_1f0 = &local_350;
      local_1c0 = &local_350;
      local_e4 = 0x10;
      local_21c = local_258;
      local_21d = 1;
      local_350 = 0;
      local_340 = 0;
      local_338 = 0;
      local_328 = 0;
      local_324 = 0;
      local_320 = 0;
      local_31c = 0;
      local_318 = 0;
      local_310 = 0;
      local_348 = 0;
      local_354 = local_248 * local_254;
      local_108 = local_308;
      local_a0 = local_1c0;
      local_330 = local_120;
      for (local_358 = 0; local_358 + 3 < local_354; local_358 = local_358 + 4) {
        local_20 = local_260;
        local_368 = *(float (*) [2])local_260;
        afStack_360 = *(float (*) [2])(local_260 + 2);
        local_28 = local_308;
        local_378 = *(float (*) [2])local_308;
        afStack_370 = *(float (*) [2])(local_308 + 2);
        afVar3 = BinaryOp_x86_functor::binary_op_rdiv::func_pack4
                           (local_241,(__m128 *)local_368,(__m128 *)local_378);
        local_18 = afVar3._0_8_;
        auVar1._8_4_ = extraout_XMM0_Dc;
        auVar1._0_8_ = local_18;
        auVar1._12_4_ = extraout_XMM0_Dd;
        local_8 = local_2b0;
        uStack_380 = auVar1._8_8_;
        uStack_10 = uStack_380;
        *(undefined8 *)local_2b0 = local_18;
        *(undefined8 *)(local_2b0 + 2) = uStack_380;
        local_260 = local_260 + 4;
        local_308 = local_308 + 4;
        local_2b0 = local_2b0 + 4;
      }
      for (; local_358 < local_354; local_358 = local_358 + 1) {
        fVar2 = BinaryOp_x86_functor::binary_op_rdiv::func(local_241,local_260,local_308);
        *local_2b0 = fVar2;
        local_260 = local_260 + 1;
        local_308 = local_308 + 1;
        local_2b0 = local_2b0 + 1;
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op_broadcast_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int elempack = a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        float* outptr = c.channel(q);

        for (int y = 0; y < h; y++)
        {
            const float* ptr1 = b.channel(q);

            const int size = w * elempack;

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                __m512 _outp = op.func_pack16(_p, _p1);
                _mm512_storeu_ps(outptr, _outp);
                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                __m256 _outp = op.func_pack8(_p, _p1);
                _mm256_storeu_ps(outptr, _outp);
                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _p1 = _mm_loadu_ps(ptr1);
                __m128 _outp = op.func_pack4(_p, _p1);
                _mm_storeu_ps(outptr, _outp);
                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = op.func(*ptr, *ptr1);
                ptr += 1;
                ptr1 += 1;
                outptr += 1;
            }
        }
    }

    return 0;
}